

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_address.cpp
# Opt level: O0

void __thiscall
Address_ElementsSegwitAddressFromStringTest_Test::~Address_ElementsSegwitAddressFromStringTest_Test
          (Address_ElementsSegwitAddressFromStringTest_Test *this)

{
  Address_ElementsSegwitAddressFromStringTest_Test *this_local;
  
  ~Address_ElementsSegwitAddressFromStringTest_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST(Address, ElementsSegwitAddressFromStringTest) {
  Address address;
  std::vector<AddressFormatData> params = AddressFormatData::ConvertListFromJson(
      "[{\"nettype\":\"Test\",\"p2pkh\":\"ff\",\"p2sh\":\"ff\",\"bech32\":\"dmy\"},"
      "{\"nettype\":\"elementsregtest\",\"p2pkh\":\"eb\",\"p2sh\":\"4b\",\"bech32\":\"ert\"},]");

  EXPECT_NO_THROW((address = Address("ert1qjfw5q2ygp0gvn450h3lu0hlwjanfsc5udafvh6", params)));
  EXPECT_STREQ("ert1qjfw5q2ygp0gvn450h3lu0hlwjanfsc5udafvh6",
               address.GetAddress().c_str());
#ifndef CFD_DISABLE_ELEMENTS
  EXPECT_EQ(NetType::kElementsRegtest, address.GetNetType());
#else
  EXPECT_EQ(NetType::kNetTypeNum, address.GetNetType());
#endif  // CFD_DISABLE_ELEMENTS
  EXPECT_EQ(AddressType::kP2wpkhAddress, address.GetAddressType());
  EXPECT_EQ(WitnessVersion::kVersion0, address.GetWitnessVersion());
  EXPECT_STREQ("925d4028880bd0c9d68fbc7fc7dfee976698629c",
               address.GetHash().GetHex().c_str());
  EXPECT_STREQ("", address.GetPubkey().GetHex().c_str());
  EXPECT_STREQ("", address.GetScript().GetHex().c_str());

  EXPECT_NO_THROW((address = Address("ert1qcc5c9wnzly8zj2dcsvxv83kupsu0uamx69u0y9lsmw7shuns2gqsflana4", params)));
  EXPECT_STREQ("ert1qcc5c9wnzly8zj2dcsvxv83kupsu0uamx69u0y9lsmw7shuns2gqsflana4",
               address.GetAddress().c_str());
#ifndef CFD_DISABLE_ELEMENTS
  EXPECT_EQ(NetType::kElementsRegtest, address.GetNetType());
#else
  EXPECT_EQ(NetType::kNetTypeNum, address.GetNetType());
#endif  // CFD_DISABLE_ELEMENTS
  EXPECT_EQ(AddressType::kP2wshAddress, address.GetAddressType());
  EXPECT_EQ(WitnessVersion::kVersion0, address.GetWitnessVersion());
}